

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddAsmJsConstantTable
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  uint uVar1;
  WriteBarrierPtr<void> *pWVar2;
  code *pcVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  AsmJsFunctionInfo *this_00;
  TypedSlotInfo *pTVar7;
  undefined4 *puVar8;
  uint lineNumber;
  Types type;
  int iVar9;
  WriteBarrierPtr<void> *pWVar10;
  
  pWVar2 = (function->m_constTable).ptr;
  uVar5 = FunctionBody::GetCountField(function,ConstantCount);
  type = INT32;
  do {
    this_00 = (AsmJsFunctionInfo *)
              FunctionProxy::GetAuxPtr((FunctionProxy *)function,AsmJsFunctionInfo);
    pTVar7 = AsmJsFunctionInfo::GetTypedSlotInfo(this_00,type);
    uVar1 = pTVar7->constCount;
    if (1 < uVar1) {
      uVar6 = WAsmJs::GetTypeByteSize(type);
      if ((1 < type - FLOAT32) && (type != INT32)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        lineNumber = 0x651;
LAB_008763e4:
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                    ,lineNumber,"((0))","UNREACHED");
        if (bVar4) {
          *puVar8 = 0;
          Throw::FatalInternalError(-0x7fffbffb);
        }
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      pWVar10 = (WriteBarrierPtr<void> *)
                ((long)&pWVar2->ptr + (ulong)pTVar7->constSrcByteOffset + (ulong)uVar6);
      iVar9 = uVar1 - 1;
      do {
        if (type == FLOAT32) {
          PrependFloat(this,builder,L"Float Constant Value",*(float *)&pWVar10->ptr);
        }
        else if (type == INT32) {
          PrependConstantInt32
                    (this,builder,L"Integer Constant Value",*(int *)&pWVar10->ptr,
                     (ConstantSizedBufferBuilderOf<int> **)0x0);
        }
        else {
          PrependDouble(this,builder,L"Double Constant Value",(double)pWVar10->ptr);
        }
        pWVar10 = (WriteBarrierPtr<void> *)((long)&pWVar10->ptr + (ulong)uVar6);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      if (pWVar2 + uVar5 < pWVar10) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        lineNumber = 0x65a;
        goto LAB_008763e4;
      }
    }
    type = type + INT64;
    if (type == LIMIT) {
      return 0;
    }
  } while( true );
}

Assistant:

uint32 AddAsmJsConstantTable(BufferBuilderList & builder, FunctionBody * function)
    {
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start Constant Table"), magicStartOfConstantTable);
#endif

        auto constTable = function->GetConstTable();
        byte* tableEnd = (byte*)(constTable + function->GetConstantCount());

        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            WAsmJs::TypedSlotInfo* typedInfo = function->GetAsmJsFunctionInfo()->GetTypedSlotInfo(type);
            uint32 constCount = typedInfo->constCount;
            if (constCount > FunctionBody::FirstRegSlot)
            {
                uint32 typeSize = WAsmJs::GetTypeByteSize(type);
                byte* byteTable = ((byte*)constTable) + typedInfo->constSrcByteOffset;
                byteTable += typeSize * FunctionBody::FirstRegSlot;
                for (uint32 reg = FunctionBody::FirstRegSlot; reg < constCount; ++reg)
                {
                    switch (type)
                    {
                    case WAsmJs::INT32:   PrependConstantInt32(builder, _u("Integer Constant Value"), *(int*)byteTable); break;
                    case WAsmJs::FLOAT32: PrependFloat(builder, _u("Float Constant Value"), *(float*)byteTable); break;
                    case WAsmJs::FLOAT64: PrependDouble(builder, _u("Double Constant Value"), *(double*)byteTable); break;
                    default:
                        Assert(UNREACHED);
                        Js::Throw::FatalInternalError();
                        break;
                    }
                    byteTable += typeSize;
                }

                if (byteTable > tableEnd)
                {
                    Assert(UNREACHED);
                    Js::Throw::FatalInternalError();
                }
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End Constant Table"), magicEndOfConstantTable);
#endif

        return size;
    }